

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000002c2f20 = 0x2d2d2d2d2d2d2d;
    uRam00000000002c2f27._0_1_ = '-';
    uRam00000000002c2f27._1_1_ = '-';
    uRam00000000002c2f27._2_1_ = '-';
    uRam00000000002c2f27._3_1_ = '-';
    uRam00000000002c2f27._4_1_ = '-';
    uRam00000000002c2f27._5_1_ = '-';
    uRam00000000002c2f27._6_1_ = '-';
    uRam00000000002c2f27._7_1_ = '-';
    DAT_002c2f10 = '-';
    DAT_002c2f10_1._0_1_ = '-';
    DAT_002c2f10_1._1_1_ = '-';
    DAT_002c2f10_1._2_1_ = '-';
    DAT_002c2f10_1._3_1_ = '-';
    DAT_002c2f10_1._4_1_ = '-';
    DAT_002c2f10_1._5_1_ = '-';
    DAT_002c2f10_1._6_1_ = '-';
    uRam00000000002c2f18 = 0x2d2d2d2d2d2d2d;
    DAT_002c2f1f = 0x2d;
    DAT_002c2f00 = '-';
    DAT_002c2f00_1._0_1_ = '-';
    DAT_002c2f00_1._1_1_ = '-';
    DAT_002c2f00_1._2_1_ = '-';
    DAT_002c2f00_1._3_1_ = '-';
    DAT_002c2f00_1._4_1_ = '-';
    DAT_002c2f00_1._5_1_ = '-';
    DAT_002c2f00_1._6_1_ = '-';
    uRam00000000002c2f08._0_1_ = '-';
    uRam00000000002c2f08._1_1_ = '-';
    uRam00000000002c2f08._2_1_ = '-';
    uRam00000000002c2f08._3_1_ = '-';
    uRam00000000002c2f08._4_1_ = '-';
    uRam00000000002c2f08._5_1_ = '-';
    uRam00000000002c2f08._6_1_ = '-';
    uRam00000000002c2f08._7_1_ = '-';
    DAT_002c2ef0 = '-';
    DAT_002c2ef0_1._0_1_ = '-';
    DAT_002c2ef0_1._1_1_ = '-';
    DAT_002c2ef0_1._2_1_ = '-';
    DAT_002c2ef0_1._3_1_ = '-';
    DAT_002c2ef0_1._4_1_ = '-';
    DAT_002c2ef0_1._5_1_ = '-';
    DAT_002c2ef0_1._6_1_ = '-';
    uRam00000000002c2ef8._0_1_ = '-';
    uRam00000000002c2ef8._1_1_ = '-';
    uRam00000000002c2ef8._2_1_ = '-';
    uRam00000000002c2ef8._3_1_ = '-';
    uRam00000000002c2ef8._4_1_ = '-';
    uRam00000000002c2ef8._5_1_ = '-';
    uRam00000000002c2ef8._6_1_ = '-';
    uRam00000000002c2ef8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000002c2ee8._0_1_ = '-';
    uRam00000000002c2ee8._1_1_ = '-';
    uRam00000000002c2ee8._2_1_ = '-';
    uRam00000000002c2ee8._3_1_ = '-';
    uRam00000000002c2ee8._4_1_ = '-';
    uRam00000000002c2ee8._5_1_ = '-';
    uRam00000000002c2ee8._6_1_ = '-';
    uRam00000000002c2ee8._7_1_ = '-';
    DAT_002c2f2f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}